

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

stb_sdict * stb_sdict_new(int use_arena)

{
  stb_sdict *psVar1;
  void *pvVar2;
  
  psVar1 = stb_sdict_create();
  if (psVar1 == (stb_sdict *)0x0) {
    psVar1 = (stb_sdict *)0x0;
  }
  else {
    if (use_arena == 0) {
      pvVar2 = (void *)0x0;
    }
    else {
      pvVar2 = malloc_base((void *)0x0,1,STB__alloc,stb_alloc_alignment);
    }
    psVar1->arena = pvVar2;
  }
  return psVar1;
}

Assistant:

stb_sdict * stb_sdict_new(int use_arena)
{
   stb_sdict *d = stb_sdict_create();
   if (d == NULL) return NULL;
   d->arena = use_arena ? stb_malloc_global(1) : NULL;
   return d;
}